

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_update.cpp
# Opt level: O0

TableUpdateState * __thiscall
duckdb::UpdateLocalState::GetUpdateState
          (UpdateLocalState *this,DataTable *table,TableCatalogEntry *tableref,
          ClientContext *context)

{
  bool bVar1;
  type pTVar2;
  unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true> *in_RDI;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  *unaff_retaddr;
  ClientContext *in_stack_00000008;
  TableCatalogEntry *in_stack_00000010;
  unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
  *in_stack_ffffffffffffffc8;
  
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>
                      *)0x187f4ce);
  if (!bVar1) {
    DataTable::InitializeUpdate
              ((DataTable *)context,in_stack_00000010,in_stack_00000008,unaff_retaddr);
    unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>::
    operator=(in_RDI,in_stack_ffffffffffffffc8);
    unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>::
    ~unique_ptr((unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
                 *)0x187f517);
  }
  pTVar2 = unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
           ::operator*(in_RDI);
  return pTVar2;
}

Assistant:

TableUpdateState &GetUpdateState(DataTable &table, TableCatalogEntry &tableref, ClientContext &context) {
		if (!update_state) {
			update_state = table.InitializeUpdate(tableref, context, bound_constraints);
		}
		return *update_state;
	}